

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtbp(fitsfile *fptr,char *name,char *value,int *status)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  int *in_RCX;
  char *in_RDX;
  long in_RSI;
  int *in_RDI;
  tcolumn *colptr;
  char message [81];
  char *loc;
  char tvalue [71];
  double dvalue;
  LONGLONG jjvalue;
  long ivalue;
  long nfield;
  long repeat;
  long width;
  int decimals;
  int datacode;
  int tstatus;
  int *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff38;
  LONGLONG *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  undefined8 local_68;
  undefined8 local_60;
  int *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  long *in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  
  if (0 < *in_RCX) {
    return *in_RCX;
  }
  uVar5 = 0;
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
           (int *)in_stack_ffffffffffffff40);
  }
  if (((*(char *)(in_RSI + 1) < 'T') || ('T' < *(char *)(in_RSI + 1))) ||
     (iVar1 = strncmp((char *)(in_RSI + 1),"TYPE",4), iVar1 != 0)) {
    if (((*(char *)(in_RSI + 1) < 'F') || ('F' < *(char *)(in_RSI + 1))) ||
       (iVar1 = strncmp((char *)(in_RSI + 1),"FORM",4), iVar1 != 0)) {
      if (((*(char *)(in_RSI + 1) < 'B') || ('B' < *(char *)(in_RSI + 1))) ||
         (iVar1 = strncmp((char *)(in_RSI + 1),"BCOL",4), iVar1 != 0)) {
        if (((*(char *)(in_RSI + 1) < 'S') || ('S' < *(char *)(in_RSI + 1))) ||
           (iVar1 = strncmp((char *)(in_RSI + 1),"SCAL",4), iVar1 != 0)) {
          if (((*(char *)(in_RSI + 1) < 'Z') || ('Z' < *(char *)(in_RSI + 1))) ||
             (iVar1 = strncmp((char *)(in_RSI + 1),"ZERO",4), iVar1 != 0)) {
            if (((*(char *)(in_RSI + 1) < 'N') || ('N' < *(char *)(in_RSI + 1))) ||
               (iVar1 = strncmp((char *)(in_RSI + 1),"NULL",4), iVar1 != 0)) {
              if (((*(char *)(in_RSI + 1) < 'D') || ('D' < *(char *)(in_RSI + 1))) ||
                 (iVar1 = strncmp((char *)(in_RSI + 1),"DIM",3), iVar1 != 0)) {
                if ((('G' < *(char *)(in_RSI + 1)) && (*(char *)(in_RSI + 1) < 'I')) &&
                   (iVar1 = strncmp((char *)(in_RSI + 1),"HEAP",4), iVar1 == 0)) {
                  if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
                    return *in_RCX;
                  }
                  iVar1 = ffc2jj((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff38);
                  if (0 < iVar1) {
                    snprintf(&stack0xfffffffffffffee8,0x51,
                             "Error reading value of %s as an integer: %s",in_RSI,in_RDX);
                    ffpmsg((char *)0x16e792);
                    return *in_RCX;
                  }
                  *(undefined8 *)(*(long *)(in_RDI + 2) + 0x3d8) = local_60;
                  return *in_RCX;
                }
              }
              else {
                if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
                  return *in_RCX;
                }
                iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38);
                if (0 < iVar1) {
                  return *in_RCX;
                }
                if (((long)in_stack_ffffffffffffffb0 < 1) ||
                   ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)
                   ) {
                  return *in_RCX;
                }
                lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) +
                        (long)in_stack_ffffffffffffffb0 * 0xa0;
                if ((*(int *)(lVar2 + -0x50) != -9999) && (*(int *)(lVar2 + -0x50) != 0x10)) {
                  return *in_RCX;
                }
                pcVar3 = strchr(in_RDX,0x28);
                if (pcVar3 == (char *)0x0) {
                  return *in_RCX;
                }
                lVar4 = strtol(pcVar3 + 1,(char **)&stack0xffffffffffffff40,10);
                if ((*(long *)(lVar2 + -0x48) != 1) && (*(long *)(lVar2 + -0x48) < lVar4)) {
                  return *in_RCX;
                }
                *(long *)(lVar2 + -8) = lVar4;
              }
            }
            else {
              iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38);
              if (0 < iVar1) {
                return *in_RCX;
              }
              if (((long)in_stack_ffffffffffffffb0 < 1) ||
                 ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0))
              {
                return *in_RCX;
              }
              lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) +
                      (long)in_stack_ffffffffffffffb0 * 0xa0;
              if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
                iVar1 = ffc2s(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              in_stack_fffffffffffffee8);
                if (0 < iVar1) {
                  return *in_RCX;
                }
                strncpy((char *)(lVar2 + -0x28),&stack0xffffffffffffff48,0x11);
                *(undefined1 *)(lVar2 + -0x17) = 0;
              }
              else {
                iVar1 = ffc2jj((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38);
                if (0 < iVar1) {
                  snprintf(&stack0xfffffffffffffee8,0x51,
                           "Error reading value of %s as an integer: %s",in_RSI,in_RDX);
                  ffpmsg((char *)0x16e45a);
                  return *in_RCX;
                }
                *(undefined8 *)(lVar2 + -0x30) = local_60;
              }
            }
          }
          else {
            iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                           in_stack_ffffffffffffff38);
            if (0 < iVar1) {
              return *in_RCX;
            }
            if (((long)in_stack_ffffffffffffffb0 < 1) ||
               ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)) {
              return *in_RCX;
            }
            lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0);
            iVar1 = ffc2dd((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8);
            if (0 < iVar1) {
              snprintf(&stack0xfffffffffffffee8,0x51,"Error reading value of %s as a double: %s",
                       in_RSI,in_RDX);
              ffpmsg((char *)0x16e24b);
              return *in_RCX;
            }
            *(undefined8 *)(lVar2 + (long)in_stack_ffffffffffffffb0 * 0xa0 + -0x38) = local_68;
          }
        }
        else {
          iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         in_stack_ffffffffffffff38);
          if (0 < iVar1) {
            return *in_RCX;
          }
          if (((long)in_stack_ffffffffffffffb0 < 1) ||
             ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)) {
            return *in_RCX;
          }
          lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0);
          iVar1 = ffc2dd((char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
          if (0 < iVar1) {
            snprintf(&stack0xfffffffffffffee8,0x51,"Error reading value of %s as a double: %s",
                     in_RSI,in_RDX);
            ffpmsg((char *)0x16e0a9);
            return *in_RCX;
          }
          *(undefined8 *)(lVar2 + (long)in_stack_ffffffffffffffb0 * 0xa0 + -0x40) = local_68;
        }
      }
      else {
        iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38);
        if (0 < iVar1) {
          return *in_RCX;
        }
        if (((long)in_stack_ffffffffffffffb0 < 1) ||
           ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)) {
          return *in_RCX;
        }
        lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0);
        if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) {
          return *in_RCX;
        }
        iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                       in_stack_ffffffffffffff38);
        if (0 < iVar1) {
          snprintf(&stack0xfffffffffffffee8,0x51,"Error reading value of %s as an integer: %s",
                   in_RSI,in_RDX);
          ffpmsg((char *)0x16df05);
          return *in_RCX;
        }
        *(long *)(lVar2 + (long)in_stack_ffffffffffffffb0 * 0xa0 + -0x58) =
             (long)in_stack_ffffffffffffffa8 + -1;
      }
    }
    else {
      iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff38);
      if (0 < iVar1) {
        return *in_RCX;
      }
      if (((long)in_stack_ffffffffffffffb0 < 1) ||
         ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)) {
        return *in_RCX;
      }
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)in_stack_ffffffffffffffb0 * 0xa0;
      iVar1 = ffc2s(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (0 < iVar1) {
        return *in_RCX;
      }
      strncpy((char *)(lVar2 + -0x14),&stack0xffffffffffffff48,9);
      *(undefined1 *)(lVar2 + -0xb) = 0;
      if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 1) {
        iVar1 = ffasfm((char *)in_RCX,(int *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8);
        if (0 < iVar1) {
          return *in_RCX;
        }
        *(undefined4 *)(lVar2 + -0x50) = 0x10;
        *(undefined8 *)(lVar2 + -0x48) = 1;
        *(long **)(lVar2 + -8) = in_stack_ffffffffffffffc0;
      }
      else {
        iVar1 = ffbnfm((char *)in_RCX,(int *)CONCAT44(uVar5,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
        if (0 < iVar1) {
          return *in_RCX;
        }
        *(int *)(lVar2 + -0x50) = in_stack_ffffffffffffffd0;
        *(int **)(lVar2 + -0x48) = in_stack_ffffffffffffffb8;
        if (in_stack_ffffffffffffffd0 == 0x10) {
          if ((*(long *)(lVar2 + -8) == 0) ||
             ((long)in_stack_ffffffffffffffb8 < *(long *)(lVar2 + -8))) {
            *(long **)(lVar2 + -8) = in_stack_ffffffffffffffc0;
          }
        }
        else {
          *(long **)(lVar2 + -8) = in_stack_ffffffffffffffc0;
        }
      }
    }
  }
  else {
    iVar1 = ffc2ii((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   in_stack_ffffffffffffff38);
    if (0 < iVar1) {
      return *in_RCX;
    }
    if (((long)in_stack_ffffffffffffffb0 < 1) ||
       ((long)*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < (long)in_stack_ffffffffffffffb0)) {
      return *in_RCX;
    }
    lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0);
    iVar1 = ffc2s(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (0 < iVar1) {
      return *in_RCX;
    }
    strcpy((char *)(lVar2 + (long)in_stack_ffffffffffffffb0 * 0xa0 + -0xa0),&stack0xffffffffffffff48
          );
  }
  return *in_RCX;
}

Assistant:

int ffgtbp(fitsfile *fptr,     /* I - FITS file pointer   */
           char *name,         /* I - name of the keyword */
           char *value,        /* I - value string of the keyword */
           int *status)        /* IO - error status       */
{
/*
  Get TaBle Parameter.  The input keyword name begins with the letter T.
  Test if the keyword is one of the table column definition keywords
  of an ASCII or binary table. If so, decode it and update the value 
  in the structure.
*/
    int tstatus, datacode, decimals;
    long width, repeat, nfield, ivalue;
    LONGLONG jjvalue;
    double dvalue;
    char tvalue[FLEN_VALUE], *loc;
    char message[FLEN_ERRMSG];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    tstatus = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if(!FSTRNCMP(name + 1, "TYPE", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield ) /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strcpy(colptr->ttype, tvalue);  /* copy col name to structure */
    }
    else if(!FSTRNCMP(name + 1, "FORM", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
            return(*status);

        strncpy(colptr->tform, tvalue, 9);  /* copy TFORM to structure */
        colptr->tform[9] = '\0';            /* make sure it is terminated */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
          if (ffasfm(tvalue, &datacode, &width, &decimals, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = TSTRING; /* store datatype code */
          colptr->trepeat = 1;      /* field repeat count == 1 */
          colptr->twidth = width;   /* the width of the field, in bytes */
        }
        else  /* binary table */
        {
          if (ffbnfm(tvalue, &datacode, &repeat, &width, status) > 0)
              return(*status);  /* bad format code */

          colptr->tdatatype = datacode; /* store datatype code */
          colptr->trepeat = (LONGLONG) repeat;     /* field repeat count  */

          /* Don't overwrite the unit string width if it was previously */
	  /* set by a TDIMn keyword and has a legal value */
          if (datacode == TSTRING) {
	    if (colptr->twidth == 0 || colptr->twidth > repeat)
              colptr->twidth = width;   /*  width of a unit string */

          } else {
              colptr->twidth = width;   /*  width of a unit value in chars */
          }
        }
    }
    else if(!FSTRNCMP(name + 1, "BCOL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == BINARY_TBL)
            return(*status);  /* binary tables don't have TBCOL keywords */

        if (ffc2ii(value, &ivalue, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);
            return(*status);
        }
        colptr->tbcol = ivalue - 1; /* convert to zero base */
    }
    else if(!FSTRNCMP(name + 1, "SCAL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tscale = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "ZERO", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if (ffc2dd(value, &dvalue, &tstatus) > 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as a double: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        colptr->tzero = dvalue;
    }
    else if(!FSTRNCMP(name + 1, "NULL", 4) )
    {
        /* get the index number */
        if( ffc2ii(name + 5, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;        /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
        {
            if (ffc2s(value, tvalue, &tstatus) > 0)  /* remove quotes */
                return(*status);

            strncpy(colptr->strnull, tvalue, 17);  /* copy TNULL string */
            colptr->strnull[17] = '\0';  /* terminate the strnull field */

        }
        else  /* binary table */
        {
            if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
            {
                snprintf(message,FLEN_ERRMSG,
                "Error reading value of %s as an integer: %s", name, value);
                ffpmsg(message);

                /* ignore this error, so don't return error status */
                return(*status);
            }
            colptr->tnull = jjvalue; /* null value for integer column */
        }
    }
    else if(!FSTRNCMP(name + 1, "DIM", 3) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't support TDIMn keyword */ 

        /* get the index number */
        if( ffc2ii(name + 4, &nfield, &tstatus) > 0) /* read index no. */
            return(*status);    /* must not be an indexed keyword */

        if (nfield < 1 || nfield > (fptr->Fptr)->tfield )  /* out of range */
            return(*status);

        colptr = (fptr->Fptr)->tableptr;     /* get pointer to columns */
        colptr = colptr + nfield - 1;   /* point to the correct column */

        /* uninitialized columns have tdatatype set = -9999 */
        if (colptr->tdatatype != -9999 && colptr->tdatatype != TSTRING)
	    return(*status);     /* this is not an ASCII string column */
	   
        loc = strchr(value, '(' );  /* find the opening parenthesis */
        if (!loc)
            return(*status);   /* not a proper TDIM keyword */

        loc++;
        width = strtol(loc, &loc, 10);  /* read size of first dimension */
        if (colptr->trepeat != 1 && colptr->trepeat < width)
	    return(*status);  /* string length is greater than column width */

        colptr->twidth = width;   /* set width of a unit string in chars */
    }
    else if (!FSTRNCMP(name + 1, "HEAP", 4) )
    {
        if ((fptr->Fptr)->hdutype == ASCII_TBL)  /* ASCII table */
            return(*status);  /* ASCII tables don't have a heap */ 

        if (ffc2jj(value, &jjvalue, &tstatus) > 0) 
        {
            snprintf(message,FLEN_ERRMSG,
            "Error reading value of %s as an integer: %s", name, value);
            ffpmsg(message);

            /* ignore this error, so don't return error status */
            return(*status);
        }
        (fptr->Fptr)->heapstart = jjvalue; /* starting byte of the heap */
        return(*status);
    }

    return(*status);
}